

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_ppu.h
# Opt level: O0

void nes_ppu_reset(nes_ppu *ppu)

{
  uint8_t default_palette [32];
  nes_ppu *ppu_local;
  
  memset(ppu,0,0x1ac);
  ppu->palettes[0] = '\t';
  ppu->palettes[1] = '\x01';
  ppu->palettes[2] = '\0';
  ppu->palettes[3] = '\x01';
  ppu->palettes[4] = '\0';
  ppu->palettes[5] = '\x02';
  ppu->palettes[6] = '\x02';
  ppu->palettes[7] = '\r';
  ppu->palettes[8] = '\b';
  ppu->palettes[9] = '\x10';
  ppu->palettes[10] = '\b';
  ppu->palettes[0xb] = '$';
  ppu->palettes[0xc] = '\0';
  ppu->palettes[0xd] = '\0';
  ppu->palettes[0xe] = '\x04';
  ppu->palettes[0xf] = ',';
  ppu->palettes[0x10] = '\t';
  ppu->palettes[0x11] = '\x01';
  ppu->palettes[0x12] = '4';
  ppu->palettes[0x13] = '\x03';
  ppu->palettes[0x14] = '\0';
  ppu->palettes[0x15] = '\x04';
  ppu->palettes[0x16] = '\0';
  ppu->palettes[0x17] = '\x14';
  ppu->palettes[0x18] = '\b';
  ppu->palettes[0x19] = ':';
  ppu->palettes[0x1a] = '\0';
  ppu->palettes[0x1b] = '\x02';
  ppu->palettes[0x1c] = '\0';
  ppu->palettes[0x1d] = ' ';
  ppu->palettes[0x1e] = ',';
  ppu->palettes[0x1f] = '\b';
  ppu->scanline = 0xf1;
  ppu->color_out = '\x0f';
  return;
}

Assistant:

static void nes_ppu_reset(nes_ppu* ppu)
{
    uint8_t default_palette[] = {
        0x09,0x01,0x00,0x01,0x00,0x02,0x02,0x0D,0x08,0x10,0x08,0x24,0x00,0x00,0x04,0x2C,
        0x09,0x01,0x34,0x03,0x00,0x04,0x00,0x14,0x08,0x3A,0x00,0x02,0x00,0x20,0x2C,0x08
    };
    memset(ppu, 0, sizeof(nes_ppu));
    memcpy(ppu->palettes, default_palette, sizeof(default_palette));
    ppu->scanline = VBLANK_BEGIN_SCANLINE;
    ppu->color_out = _NES_PPU_COLOR_BLACK;
}